

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::~TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,void **vtt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  TPZCompEl *pTVar5;
  TPZGeoEl *pTVar6;
  TPZCompElSide *celside_00;
  undefined4 extraout_var;
  long *in_RSI;
  TPZCompEl *in_RDI;
  int in_stack_000000a4;
  TPZGeoElSide *in_stack_000000a8;
  TPZConnect *c_1;
  int cindex_1;
  TPZInterpolatedElement *intelsmall;
  TPZGeoEl *gelsmall;
  TPZCompEl *celsmall;
  TPZCompElSide celside;
  int64_t el;
  int64_t ncel;
  TPZConnect *c;
  int cindex;
  TPZCompElSide largecel;
  TPZStack<TPZCompElSide,_10> celstack;
  TPZGeoElSide gelside;
  int side;
  TPZGeoEl *gel;
  TPZManVector<long,_3> *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  TPZIntelGen<pzshape::TPZShapeLinear> *in_stack_fffffffffffffe00;
  TPZIntelGen<pzshape::TPZShapeLinear> *local_1f0;
  TPZCompElSide local_138;
  int64_t local_128;
  long local_120;
  undefined8 local_118;
  undefined4 local_10c;
  TPZCompElSide local_108;
  TPZVec<TPZCompElSide> local_f8 [2];
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  TPZStack<TPZCompElSide,_10> *in_stack_ffffffffffffff68;
  TPZGeoElSide *in_stack_ffffffffffffff70;
  TPZGeoElSide local_38;
  int local_20;
  undefined4 local_1c;
  TPZGeoEl *local_18;
  
  *(long *)in_RDI = *in_RSI;
  *(long *)((long)&in_RDI->field_0x0 + *(long *)(*(long *)in_RDI + -0x60)) = in_RSI[9];
  local_18 = TPZCompEl::Reference
                       ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if ((local_18 == (TPZGeoEl *)0x0) || (pTVar5 = TPZGeoEl::Reference(local_18), pTVar5 == in_RDI)) {
    for (local_20 = 2; local_20 < 3; local_20 = local_20 + 1) {
      iVar2 = pztopology::TPZLine::SideDimension(0x19f5f3b);
      if (iVar2 == 0) {
        TPZCompEl::Reference
                  ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffffe00,
                   (TPZGeoEl *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
        TPZStack<TPZCompElSide,_10>::TPZStack
                  ((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffe00);
        TPZGeoElSide::LowerLevelCompElementList2(in_stack_000000a8,in_stack_000000a4);
        bVar1 = TPZCompElSide::operator_cast_to_bool(&local_108);
        if (bVar1) {
          local_10c = (**(code **)(*(long *)in_RDI + 0x250))(in_RDI,0,local_20);
          local_118 = (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_10c);
          TPZConnect::RemoveDepend((TPZConnect *)in_stack_fffffffffffffdf0);
        }
        pTVar6 = TPZGeoElSide::Element(&local_38);
        if (pTVar6 != (TPZGeoEl *)0x0) {
          TPZGeoElSide::HigherLevelCompElementList3
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff60);
        }
        local_120 = TPZVec<TPZCompElSide>::size(local_f8);
        for (local_128 = 0; local_128 < local_120; local_128 = local_128 + 1) {
          celside_00 = TPZVec<TPZCompElSide>::operator[](local_f8,local_128);
          TPZCompElSide::TPZCompElSide(&local_138,celside_00);
          pTVar5 = TPZCompElSide::Element(&local_138);
          pTVar6 = TPZCompEl::Reference
                             ((TPZCompEl *)
                              CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          iVar2 = TPZCompElSide::Side(&local_138);
          iVar2 = (**(code **)(*(long *)pTVar6 + 0x208))(pTVar6,iVar2);
          iVar3 = (**(code **)(*(long *)local_18 + 0x210))();
          if (iVar2 == iVar3 + -1) {
            if (pTVar5 == (TPZCompEl *)0x0) {
              local_1f0 = (TPZIntelGen<pzshape::TPZShapeLinear> *)0x0;
            }
            else {
              local_1f0 = (TPZIntelGen<pzshape::TPZShapeLinear> *)
                          __dynamic_cast(pTVar5,&TPZCompEl::typeinfo,
                                         &TPZInterpolatedElement::typeinfo,0);
            }
            if (local_1f0 == (TPZIntelGen<pzshape::TPZShapeLinear> *)0x0) {
              pzinternal::DebugStopImpl((char *)this,(size_t)vtt);
            }
            in_stack_fffffffffffffe00 = local_1f0;
            uVar4 = TPZCompElSide::Side(&local_138);
            in_stack_fffffffffffffdfc =
                 (*(*(_func_int ***)
                     &(in_stack_fffffffffffffe00->super_TPZInterpolatedElement).
                      super_TPZInterpolationSpace.super_TPZCompEl)[0x4a])
                           (in_stack_fffffffffffffe00,0,(ulong)uVar4);
            iVar2 = (*(*(_func_int ***)
                        &(local_1f0->super_TPZInterpolatedElement).super_TPZInterpolationSpace.
                         super_TPZCompEl)[0x15])(local_1f0,(ulong)in_stack_fffffffffffffdfc);
            in_stack_fffffffffffffdf0 = (TPZManVector<long,_3> *)CONCAT44(extraout_var,iVar2);
            TPZConnect::RemoveDepend((TPZConnect *)in_stack_fffffffffffffdf0);
          }
        }
        TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x19f62c3);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x19f62d0);
      }
    }
    if (local_18 != (TPZGeoEl *)0x0) {
      TPZGeoEl::ResetReference(local_18);
    }
    local_1c = 0;
  }
  else {
    local_1c = 1;
  }
  TPZManVector<long,_3>::~TPZManVector(in_stack_fffffffffffffdf0);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::~list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x19f6332);
  TPZManVector<int,_2>::~TPZManVector((TPZManVector<int,_2> *)in_stack_fffffffffffffdf0);
  TPZIntelGen<pzshape::TPZShapeLinear>::~TPZIntelGen
            (in_stack_fffffffffffffe00,
             (void **)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::~TPZCompElHDiv(){
    TPZGeoEl *gel = this->Reference();
    if (gel && gel->Reference() != this) {
        return;
    }
    for (int side=TSHAPE::NCornerNodes; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension-1) {
            continue;
        }
        TPZGeoElSide gelside(this->Reference(),side);
        TPZStack<TPZCompElSide> celstack;
        TPZCompElSide largecel = gelside.LowerLevelCompElementList2(0);
        if (largecel) {
            int cindex = SideConnectLocId(0, side);
            TPZConnect &c = this->Connect(cindex);
            c.RemoveDepend();
        }
        if (gelside.Element()){
            gelside.HigherLevelCompElementList3(celstack, 0, 1);
        }
        int64_t ncel = celstack.size();
        for (int64_t el=0; el<ncel; el++) {
            TPZCompElSide celside = celstack[el];
            TPZCompEl *celsmall = celside.Element();
            TPZGeoEl *gelsmall = celsmall->Reference();
            if (gelsmall->SideDimension(celside.Side()) != gel->Dimension()-1) {
                continue;
            }
            TPZInterpolatedElement *intelsmall = dynamic_cast<TPZInterpolatedElement *>(celsmall);
            if (!intelsmall) {
                DebugStop();
            }
            int cindex = intelsmall->SideConnectLocId(0, celside.Side());
            TPZConnect &c = intelsmall->Connect(cindex);
            c.RemoveDepend();
        }
    }
    if (gel){
        gel->ResetReference();
    }
}